

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  uint uVar1;
  bool bVar2;
  int local_3c;
  int ret;
  int overflow;
  secp256k1_scalar term;
  uchar *tweak32_local;
  secp256k1_scalar *sec_local;
  
  local_3c = 0;
  term.d[3] = (uint64_t)tweak32;
  secp256k1_scalar_set_b32((secp256k1_scalar *)&ret,tweak32,&local_3c);
  bVar2 = local_3c != 0;
  uVar1 = secp256k1_eckey_privkey_tweak_add(sec,(secp256k1_scalar *)&ret);
  secp256k1_scalar_clear((secp256k1_scalar *)&ret);
  return ((bVar2 ^ 0xffU) & 1) & uVar1;
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}